

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::Check(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
        *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *pPVar4;
  size_t sVar5;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *pDVar6;
  undefined1 local_78 [8];
  Iterator segmentsIterator;
  Iterator fullSegmentsIterator;
  Iterator emptySegmentsIterator;
  Iterator decommitSegmentsIterator;
  
  if (DAT_0145c440 == '\x01') {
    bVar2 = HasZeroQueuedPages(this);
    if ((bVar2) && (this->waitingToEnterIdleDecommit == false)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x9d5,"(!this->HasZeroQueuedPages() || this->waitingToEnterIdleDecommit)",
                         "!this->HasZeroQueuedPages() || this->waitingToEnterIdleDecommit");
      if (!bVar2) goto LAB_0067355b;
      *puVar3 = 0;
    }
  }
  pDVar6 = &this->segments;
  local_78 = (undefined1  [8])pDVar6;
  segmentsIterator.list = pDVar6;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  sVar5 = 0;
  while( true ) {
    if (pDVar6 == (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                   *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar2) goto LAB_0067355b;
      *puVar3 = 0;
      pDVar6 = segmentsIterator.list;
    }
    segmentsIterator.list =
         (pDVar6->
         super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).next
         .list;
    if ((undefined1  [8])segmentsIterator.list == local_78) break;
    pPVar4 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
             Iterator::Data((Iterator *)local_78);
    sVar5 = sVar5 + pPVar4->freePageCount;
    pDVar6 = segmentsIterator.list;
  }
  segmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)0x0;
  segmentsIterator.current =
       &(this->fullSegments).
        super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>;
  fullSegmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
       segmentsIterator.current;
  while( true ) {
    if (fullSegmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)0x0
       ) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar2) goto LAB_0067355b;
      *puVar3 = 0;
    }
    fullSegmentsIterator.list =
         ((fullSegmentsIterator.list)->
         super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).next
         .list;
    if (fullSegmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
        segmentsIterator.current) break;
    pPVar4 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
             Iterator::Data((Iterator *)&segmentsIterator.current);
    sVar5 = sVar5 + pPVar4->freePageCount;
  }
  fullSegmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)0x0;
  fullSegmentsIterator.current =
       &(this->emptySegments).
        super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>;
  emptySegmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
       fullSegmentsIterator.current;
  while( true ) {
    if (emptySegmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)0x0
       ) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar2) goto LAB_0067355b;
      *puVar3 = 0;
    }
    emptySegmentsIterator.list =
         ((emptySegmentsIterator.list)->
         super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).next
         .list;
    if (emptySegmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
        fullSegmentsIterator.current) break;
    pPVar4 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
             Iterator::Data((Iterator *)&fullSegmentsIterator.current);
    sVar5 = sVar5 + pPVar4->freePageCount;
  }
  emptySegmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)0x0;
  emptySegmentsIterator.current =
       &(this->decommitSegments).
        super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>;
  decommitSegmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
       emptySegmentsIterator.current;
  while( true ) {
    if (decommitSegmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)0x0
       ) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar2) goto LAB_0067355b;
      *puVar3 = 0;
    }
    decommitSegmentsIterator.list =
         ((decommitSegmentsIterator.list)->
         super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).next
         .list;
    if (decommitSegmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
        emptySegmentsIterator.current) break;
    pPVar4 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
             Iterator::Data((Iterator *)&emptySegmentsIterator.current);
    sVar5 = sVar5 + pPVar4->freePageCount;
  }
  if (this->freePageCount != sVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x9f2,"(freePageCount == currentFreePageCount)",
                       "freePageCount == currentFreePageCount");
    if (!bVar2) {
LAB_0067355b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::Check()
{
#if ENABLE_BACKGROUND_PAGE_ZEROING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        // We may have backed-off from the idle decommit on the background thread.
        Assert(!this->HasZeroQueuedPages() || this->waitingToEnterIdleDecommit);
    }
#endif
    size_t currentFreePageCount = 0;

    typename DListBase<TPageSegment>::Iterator segmentsIterator(&segments);
    while (segmentsIterator.Next())
    {
        currentFreePageCount += segmentsIterator.Data().GetFreePageCount();
    }

    typename DListBase<TPageSegment>::Iterator fullSegmentsIterator(&fullSegments);
    while (fullSegmentsIterator.Next())
    {
        currentFreePageCount += fullSegmentsIterator.Data().GetFreePageCount();
    }

    typename DListBase<TPageSegment>::Iterator emptySegmentsIterator(&emptySegments);
    while (emptySegmentsIterator.Next())
    {
        currentFreePageCount += emptySegmentsIterator.Data().GetFreePageCount();
    }

    typename DListBase<TPageSegment>::Iterator decommitSegmentsIterator(&decommitSegments);
    while (decommitSegmentsIterator.Next())
    {
        currentFreePageCount += decommitSegmentsIterator.Data().GetFreePageCount();
    }

    Assert(freePageCount == currentFreePageCount);
}